

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O0

djpeg_dest_ptr jinit_write_targa(j_decompress_ptr cinfo)

{
  djpeg_dest_ptr pdVar1;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var2;
  JSAMPARRAY ppJVar3;
  j_decompress_ptr in_RDI;
  tga_dest_ptr dest;
  
  pdVar1 = (djpeg_dest_ptr)(*in_RDI->mem->alloc_small)((j_common_ptr)in_RDI,1,0x48);
  pdVar1->start_output = start_output_tga;
  pdVar1->finish_output = finish_output_tga;
  pdVar1->calc_buffer_dimensions = calc_buffer_dimensions_tga;
  jpeg_calc_output_dimensions(cinfo);
  (*pdVar1->calc_buffer_dimensions)(in_RDI,pdVar1);
  p_Var2 = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)
           (*in_RDI->mem->alloc_small)
                     ((j_common_ptr)in_RDI,1,(ulong)*(uint *)&pdVar1[1].put_pixel_rows);
  pdVar1[1].start_output = p_Var2;
  ppJVar3 = (*in_RDI->mem->alloc_sarray)
                      ((j_common_ptr)in_RDI,1,*(JDIMENSION *)&pdVar1[1].put_pixel_rows,1);
  pdVar1->buffer = ppJVar3;
  pdVar1->buffer_height = 1;
  return pdVar1;
}

Assistant:

GLOBAL(djpeg_dest_ptr)
jinit_write_targa(j_decompress_ptr cinfo)
{
  tga_dest_ptr dest;

  /* Create module interface object, fill in method pointers */
  dest = (tga_dest_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(tga_dest_struct));
  dest->pub.start_output = start_output_tga;
  dest->pub.finish_output = finish_output_tga;
  dest->pub.calc_buffer_dimensions = calc_buffer_dimensions_tga;

  /* Calculate output image dimensions so we can allocate space */
  jpeg_calc_output_dimensions(cinfo);

  /* Create I/O buffer. */
  dest->pub.calc_buffer_dimensions(cinfo, (djpeg_dest_ptr)dest);
  dest->iobuffer = (char *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                (size_t)(dest->buffer_width * sizeof(char)));

  /* Create decompressor output buffer. */
  dest->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, dest->buffer_width, (JDIMENSION)1);
  dest->pub.buffer_height = 1;

  return (djpeg_dest_ptr)dest;
}